

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrixTriangular.h
# Opt level: O2

void __thiscall
Eigen::internal::tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1>::operator()
          (tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1> *this,ResScalar *res,
          long resStride,double *blockA,double *blockB,long size,long depth,ResScalar *alpha,
          double *workspace)

{
  Scalar *pSVar1;
  long lVar2;
  ResScalar *pRVar3;
  long lVar4;
  long rows;
  long lVar5;
  long lVar6;
  long lVar7;
  long j1;
  long col;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  ResScalar *local_118;
  Matrix<double,_4,_4,_0,_4,_4> buffer;
  
  lVar7 = 0;
  lVar2 = size;
  local_118 = res;
  while( true ) {
    lVar4 = 4;
    if (lVar2 < 4) {
      lVar4 = lVar2;
    }
    lVar5 = 0;
    if (0 < lVar4) {
      lVar5 = lVar4;
    }
    rows = size - lVar7;
    if (rows == 0 || size < lVar7) break;
    if (3 < rows) {
      rows = 4;
    }
    DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&buffer);
    gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
              (&gebp_kernel,(ResScalar *)&buffer,4,blockA + lVar7 * depth,blockB + lVar7 * depth,
               rows,depth,rows,*alpha,-1,-1,0,0,workspace);
    pRVar3 = local_118;
    for (col = 0; col != lVar5; col = col + 1) {
      for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 1) {
        pSVar1 = DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)&buffer,
                            col + lVar6,col);
        pRVar3[lVar6] = *pSVar1 + pRVar3[lVar6];
      }
      lVar4 = lVar4 + -1;
      pRVar3 = pRVar3 + resStride + 1;
    }
    lVar4 = rows + lVar7;
    gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
              (&gebp_kernel,res + lVar7 * resStride + lVar4,resStride,blockA + lVar4 * depth,
               blockB + lVar7 * depth,size - lVar4,depth,rows,*alpha,-1,-1,0,0,workspace);
    lVar7 = lVar7 + 4;
    lVar2 = lVar2 + -4;
    local_118 = local_118 + resStride * 4 + 4;
  }
  return;
}

Assistant:

void operator()(ResScalar* res, Index resStride, const LhsScalar* blockA, const RhsScalar* blockB, Index size, Index depth, const ResScalar& alpha, RhsScalar* workspace)
  {
    gebp_kernel<LhsScalar, RhsScalar, Index, mr, nr, ConjLhs, ConjRhs> gebp_kernel;
    Matrix<ResScalar,BlockSize,BlockSize,ColMajor> buffer;

    // let's process the block per panel of actual_mc x BlockSize,
    // again, each is split into three parts, etc.
    for (Index j=0; j<size; j+=BlockSize)
    {
      Index actualBlockSize = std::min<Index>(BlockSize,size - j);
      const RhsScalar* actual_b = blockB+j*depth;

      if(UpLo==Upper)
        gebp_kernel(res+j*resStride, resStride, blockA, actual_b, j, depth, actualBlockSize, alpha,
                    -1, -1, 0, 0, workspace);

      // selfadjoint micro block
      {
        Index i = j;
        buffer.setZero();
        // 1 - apply the kernel on the temporary buffer
        gebp_kernel(buffer.data(), BlockSize, blockA+depth*i, actual_b, actualBlockSize, depth, actualBlockSize, alpha,
                    -1, -1, 0, 0, workspace);
        // 2 - triangular accumulation
        for(Index j1=0; j1<actualBlockSize; ++j1)
        {
          ResScalar* r = res + (j+j1)*resStride + i;
          for(Index i1=UpLo==Lower ? j1 : 0;
              UpLo==Lower ? i1<actualBlockSize : i1<=j1; ++i1)
            r[i1] += buffer(i1,j1);
        }
      }

      if(UpLo==Lower)
      {
        Index i = j+actualBlockSize;
        gebp_kernel(res+j*resStride+i, resStride, blockA+depth*i, actual_b, size-i, depth, actualBlockSize, alpha,
                    -1, -1, 0, 0, workspace);
      }
    }
  }